

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall ON_BinaryArchive::GetCurrentChunk(ON_BinaryArchive *this,ON_3DM_CHUNK *chunk)

{
  int iVar1;
  ON_3DM_BIG_CHUNK *pOVar2;
  size_t sVar3;
  uint uVar4;
  char *sFormat;
  uint uVar5;
  int line_number;
  ON__UINT16 OVar6;
  ON__UINT32 OVar7;
  uint uVar8;
  ON__UINT16 OVar9;
  long lVar10;
  ulong uVar11;
  
  chunk->m_do_length = 0;
  chunk->m_do_crc16 = 0;
  chunk->m_crc16 = 0;
  chunk->m_do_crc32 = 0;
  chunk->m_crc32 = 0;
  chunk->m_offset = 0;
  chunk->m_typecode = 0;
  chunk->m_value = 0;
  iVar1 = (this->m_chunk).m_count;
  lVar10 = (long)iVar1;
  if (lVar10 < 1) {
    sVar3 = 0;
    uVar11 = 0;
    uVar4 = 0;
    uVar8 = 0;
    OVar9 = 0;
    uVar5 = 0;
    OVar6 = 0;
    OVar7 = 0;
  }
  else {
    pOVar2 = (this->m_chunk).m_a;
    sVar3 = pOVar2[lVar10 + -1].m_start_offset;
    uVar11 = pOVar2[lVar10 + -1].m_big_value;
    uVar4 = pOVar2[lVar10 + -1].m_typecode;
    OVar6 = pOVar2[lVar10 + -1].m_crc16;
    OVar7 = pOVar2[lVar10 + -1].m_crc32;
    uVar8 = (uint)(pOVar2[lVar10 + -1].m_bLongChunk != '\0');
    OVar9 = (ON__UINT16)(pOVar2[lVar10 + -1].m_do_crc16 != '\0');
    uVar5 = (uint)(pOVar2[lVar10 + -1].m_do_crc32 != '\0');
  }
  if (iVar1 < 1) {
    return iVar1;
  }
  chunk->m_offset = sVar3;
  chunk->m_typecode = uVar4;
  if ((int)uVar4 < 0) {
    if ((long)(int)uVar11 == uVar11) goto LAB_003a33ff;
    sFormat = "i64 too big to convert to 4 byte signed int";
    line_number = 0xee;
  }
  else {
    if (uVar11 >> 0x20 == 0) goto LAB_003a33ff;
    sFormat = "u64 too big to convert to 4 byte unsigned int";
    line_number = 0xfc;
  }
  uVar11 = 0;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
LAB_003a33ff:
  chunk->m_value = (int)uVar11;
  chunk->m_do_length = uVar8;
  chunk->m_do_crc16 = OVar9;
  chunk->m_do_crc32 = uVar5;
  chunk->m_crc16 = OVar6;
  chunk->m_crc32 = OVar7;
  return iVar1;
}

Assistant:

int ON_BinaryArchive::GetCurrentChunk(ON_3DM_CHUNK& chunk) const
{
  ON_3DM_BIG_CHUNK big_chunk;
  memset(&chunk,0,sizeof(ON_3DM_CHUNK));
  memset(&big_chunk,0,sizeof(big_chunk));
  int rc = GetCurrentChunk(big_chunk);
  if ( rc > 0 )
  {
    chunk.m_offset = (size_t)big_chunk.m_start_offset;
    chunk.m_typecode = big_chunk.m_typecode;

    ON__INT32 i32 = 0;
    if ( ON_IsLongChunkTypecode( big_chunk.m_typecode ) )
      DownSizeUINT( (ON__UINT64)big_chunk.m_big_value, (ON__UINT32*)&i32 );
    else
      DownSizeINT( big_chunk.m_big_value, &i32 );
    chunk.m_value = i32;

    chunk.m_do_length = big_chunk.m_bLongChunk ? 1 : 0;
    chunk.m_do_crc16 = big_chunk.m_do_crc16 ? 1 : 0;
    chunk.m_do_crc32 = big_chunk.m_do_crc32 ? 1 : 0;
    chunk.m_crc16 = big_chunk.m_crc16;
    chunk.m_crc32 = big_chunk.m_crc32;
  }
  return rc;
}